

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_server_socket.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/tests/linux/test_linux_server_socket.c"
            );
  UnityDefaultTestRun(test_accept_error,"test_accept_error",0x3f3);
  UnityDefaultTestRun(test_accept_bind_address,"test_accept_bind_address",0x3f4);
  UnityDefaultTestRun(test_accept_close_in_accept_handler,"test_accept_close_in_accept_handler",
                      0x3f5);
  UnityDefaultTestRun(test_accept_close_in_accept_handler_no_close_hook,
                      "test_accept_close_in_accept_handler_no_close_hook",0x3f6);
  UnityDefaultTestRun(test_accept_no_handler,"test_accept_no_handler",0x3f7);
  UnityDefaultTestRun(test_accept_eventloop_add_fails,"test_accept_eventloop_add_fails",0x3f8);
  UnityDefaultTestRun(test_accept_wouldblock,"test_accept_wouldblock",0x3f9);
  UnityDefaultTestRun(test_accept_after_close,"test_accept_after_close",0x3fa);
  UnityDefaultTestRun(test_accept_fails,"test_accept_fails",0x3fb);
  UnityDefaultTestRun(test_init_fails_no_socket,"test_init_fails_no_socket",0x3fc);
  UnityDefaultTestRun(test_init_listen_fails,"test_init_listen_fails",0x3fd);
  UnityDefaultTestRun(test_init_setsockopt_fails,"test_init_setsockopt_fails",0x3fe);
  UnityDefaultTestRun(test_accept_bind_ipv6,"test_accept_bind_ipv6",0x3ff);
  UnityDefaultTestRun(test_accept_bind_abstract_uds,"test_accept_bind_abstract_uds",0x400);
  UnityDefaultTestRun(test_accept_bind_uds_no_stale_file,"test_accept_bind_uds_no_stale_file",0x401)
  ;
  UnityDefaultTestRun(test_accept_bind_uds_stale_file,"test_accept_bind_uds_stale_file",0x402);
  UnityDefaultTestRun(test_accept_bind_uds_stale_file_cant_remove,
                      "test_accept_bind_uds_stale_file_cant_remove",0x403);
  UnityDefaultTestRun(test_accept_bind_wrong_family,"test_accept_bind_wrong_family",0x404);
  UnityDefaultTestRun(test_init_bind_fails,"test_init_bind_fails",0x405);
  UnityDefaultTestRun(test_init_bind_no_server_socket,"test_init_bind_no_server_socket",0x406);
  UnityDefaultTestRun(test_init_bind_no_endpoint,"test_init_bind_no_endpoint",0x407);
  UnityDefaultTestRun(test_accept_malloc_fails,"test_accept_malloc_fails",0x408);
  UnityDefaultTestRun(test_enable_reuse_address,"test_enable_reuse_address",0x409);
  UnityDefaultTestRun(test_disable_reuse_address,"test_disable_reuse_address",0x40a);
  UnityDefaultTestRun(test_enable_tfo,"test_enable_tfo",0x40c);
  UnityDefaultTestRun(test_disable_tfo,"test_disable_tfo",0x40d);
  UnityDefaultTestRun(test_tfo_setsockopt_fails,"test_tfo_setsockopt_fails",0x40e);
  UnityDefaultTestRun(test_init_register_read_fails,"test_init_register_read_fails",0x410);
  UnityDefaultTestRun(test_accept_socket_init_fails,"test_accept_socket_init_fails",0x411);
  UnityDefaultTestRun(test_accept_socket_close_socket,"test_accept_socket_close_socket",0x412);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
	UNITY_BEGIN();

	RUN_TEST(test_accept_error);
	RUN_TEST(test_accept_bind_address);
	RUN_TEST(test_accept_close_in_accept_handler);
	RUN_TEST(test_accept_close_in_accept_handler_no_close_hook);
	RUN_TEST(test_accept_no_handler);
	RUN_TEST(test_accept_eventloop_add_fails);
	RUN_TEST(test_accept_wouldblock);
	RUN_TEST(test_accept_after_close);
	RUN_TEST(test_accept_fails);
	RUN_TEST(test_init_fails_no_socket);
	RUN_TEST(test_init_listen_fails);
	RUN_TEST(test_init_setsockopt_fails);
	RUN_TEST(test_accept_bind_ipv6);
	RUN_TEST(test_accept_bind_abstract_uds);
	RUN_TEST(test_accept_bind_uds_no_stale_file);
	RUN_TEST(test_accept_bind_uds_stale_file);
	RUN_TEST(test_accept_bind_uds_stale_file_cant_remove);
	RUN_TEST(test_accept_bind_wrong_family);
	RUN_TEST(test_init_bind_fails);
	RUN_TEST(test_init_bind_no_server_socket);
	RUN_TEST(test_init_bind_no_endpoint);
	RUN_TEST(test_accept_malloc_fails);
	RUN_TEST(test_enable_reuse_address);
	RUN_TEST(test_disable_reuse_address);

	RUN_TEST(test_enable_tfo);
	RUN_TEST(test_disable_tfo);
	RUN_TEST(test_tfo_setsockopt_fails);

	RUN_TEST(test_init_register_read_fails);
	RUN_TEST(test_accept_socket_init_fails);
	RUN_TEST(test_accept_socket_close_socket);
	return UNITY_END();
}